

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_view_data.hpp
# Opt level: O2

void duckdb::ArrowListViewData<int>::AppendListMetadata
               (ArrowAppendData *append_data,UnifiedVectorFormat *format,idx_t from,idx_t to,
               vector<unsigned_int,_true> *child_sel)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  bool bVar4;
  ArrowBuffer *pAVar5;
  ArrowBuffer *pAVar6;
  InvalidInputException *this;
  int params_1;
  long lVar7;
  idx_t k;
  long lVar8;
  idx_t iVar9;
  int *piVar10;
  allocator local_99;
  long local_98;
  data_ptr_t local_90;
  data_ptr_t local_88;
  UnifiedVectorFormat *local_80;
  long local_78;
  data_ptr_t local_70;
  TemplatedValidityMask<unsigned_long> *local_68;
  ArrowAppendData *local_60;
  idx_t local_58;
  string local_50;
  
  lVar7 = to - from;
  local_58 = from;
  pAVar5 = ArrowAppendData::GetMainBuffer(append_data);
  pAVar6 = ArrowAppendData::GetMainBuffer(append_data);
  ArrowBuffer::resize(pAVar5,pAVar6->count + lVar7 * 4);
  pAVar5 = ArrowAppendData::GetAuxBuffer(append_data);
  pAVar6 = ArrowAppendData::GetAuxBuffer(append_data);
  ArrowBuffer::resize(pAVar5,lVar7 * 4 + pAVar6->count);
  pdVar1 = format->data;
  pAVar5 = ArrowAppendData::GetMainBuffer(append_data);
  pdVar2 = pAVar5->dataptr;
  pAVar5 = ArrowAppendData::GetAuxBuffer(append_data);
  local_90 = pAVar5->dataptr;
  iVar9 = append_data->row_count;
  if (iVar9 == 0) {
    params_1 = 0;
  }
  else {
    params_1 = *(int *)(local_90 + iVar9 * 4 + -4) + *(int *)(pdVar2 + iVar9 * 4 + -4);
  }
  local_68 = &(format->validity).super_TemplatedValidityMask<unsigned_long>;
  local_98 = 0;
  local_88 = pdVar2;
  local_80 = format;
  local_78 = lVar7;
  local_70 = pdVar1;
  local_60 = append_data;
  do {
    if (local_98 == lVar7) {
      return;
    }
    iVar9 = local_98 + local_58;
    psVar3 = format->sel->sel_vector;
    if (psVar3 != (sel_t *)0x0) {
      iVar9 = (idx_t)psVar3[iVar9];
    }
    lVar8 = local_60->row_count + local_98;
    bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid(local_68,iVar9);
    if (bVar4) {
      lVar7 = *(long *)(local_70 + iVar9 * 0x10 + 8);
      if ((params_1 + lVar7 & 0xffffffff80000000U) != 0) {
        this = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_50,
                   "Arrow Appender: The maximum combined list offset for regular list buffers is %u but the offset of %lu exceeds this.\n* SET arrow_large_buffer_size=true to use large list buffers"
                   ,&local_99);
        InvalidInputException::InvalidInputException<int,int>(this,&local_50,0x7fffffff,params_1);
        __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      piVar10 = (int *)(local_70 + iVar9 * 0x10);
      *(int *)(local_88 + lVar8 * 4) = params_1;
      *(int *)(local_90 + lVar8 * 4) = (int)lVar7;
      for (lVar8 = 0; lVar7 != lVar8; lVar8 = lVar8 + 1) {
        local_50._M_dataplus._M_p._0_4_ = *piVar10 + (int)lVar8;
        ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&child_sel->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
                   (uint *)&local_50);
      }
      params_1 = (int)(params_1 + lVar7);
      lVar7 = local_78;
      format = local_80;
    }
    else {
      *(int *)(local_88 + lVar8 * 4) = params_1;
      pdVar1 = local_90 + lVar8 * 4;
      pdVar1[0] = '\0';
      pdVar1[1] = '\0';
      pdVar1[2] = '\0';
      pdVar1[3] = '\0';
    }
    local_98 = local_98 + 1;
  } while( true );
}

Assistant:

static void AppendListMetadata(ArrowAppendData &append_data, UnifiedVectorFormat &format, idx_t from, idx_t to,
	                               vector<sel_t> &child_sel) {
		// resize the offset buffer - the offset buffer holds the offsets into the child array
		idx_t size = to - from;
		append_data.GetMainBuffer().resize(append_data.GetMainBuffer().size() + sizeof(BUFTYPE) * size);
		append_data.GetAuxBuffer().resize(append_data.GetAuxBuffer().size() + sizeof(BUFTYPE) * size);
		auto data = UnifiedVectorFormat::GetData<list_entry_t>(format);
		auto offset_data = append_data.GetMainBuffer().GetData<BUFTYPE>();
		auto size_data = append_data.GetAuxBuffer().GetData<BUFTYPE>();

		BUFTYPE last_offset =
		    append_data.row_count ? offset_data[append_data.row_count - 1] + size_data[append_data.row_count - 1] : 0;
		for (idx_t i = 0; i < size; i++) {
			auto source_idx = format.sel->get_index(i + from);
			auto offset_idx = append_data.row_count + i;

			if (!format.validity.RowIsValid(source_idx)) {
				offset_data[offset_idx] = last_offset;
				size_data[offset_idx] = 0;
				continue;
			}

			// append the offset data
			auto list_length = data[source_idx].length;
			if (std::is_same<BUFTYPE, int32_t>::value == true &&
			    (uint64_t)last_offset + list_length > NumericLimits<int32_t>::Maximum()) {
				throw InvalidInputException(
				    "Arrow Appender: The maximum combined list offset for regular list buffers is "
				    "%u but the offset of %lu exceeds this.\n* SET arrow_large_buffer_size=true to use large list "
				    "buffers",
				    NumericLimits<int32_t>::Maximum(), last_offset);
			}
			offset_data[offset_idx] = last_offset;
			size_data[offset_idx] = UnsafeNumericCast<BUFTYPE>(list_length);
			last_offset += list_length;

			for (idx_t k = 0; k < list_length; k++) {
				child_sel.push_back(UnsafeNumericCast<sel_t>(data[source_idx].offset + k));
			}
		}
	}